

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,kj::_::DebugComparison<int&,int>&,char_const(&)[19],kj::StringPtr_const&>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          DebugComparison<int_&,_int> *params,char (*params_1) [19],StringPtr *params_2)

{
  undefined4 in_register_00000014;
  StringPtr *params_00;
  long lVar1;
  String argValues [3];
  
  this->exception = (Exception *)0x0;
  str<kj::_::DebugComparison<int&,int>&>
            (argValues,(kj *)params,
             (DebugComparison<int_&,_int> *)CONCAT44(in_register_00000014,line));
  str<char_const(&)[19]>((kj *)(argValues + 1),params_1);
  str<kj::StringPtr_const&>(argValues + 2,(kj *)params_2,params_00);
  init(this,(EVP_PKEY_CTX *)file);
  lVar1 = 0x30;
  do {
    Array<char>::~Array((Array<char> *)((long)&argValues[0].content.ptr + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}